

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::CompLayer::renderMatteLayer
          (CompLayer *this,VPainter *painter,VRle *mask,VRle *matteRle,Layer *layer,Layer *src,
          SurfaceCache *cache)

{
  VRle *pVVar1;
  VRle *pVVar2;
  byte bVar3;
  Format format;
  long extraout_RDX;
  VRect VVar4;
  VBitmap layerBitmap;
  VPainter layerPainter;
  VPainter srcPainter;
  undefined1 local_2c0 [8];
  VRect local_2b8;
  size_t local_2a8;
  Layer *local_2a0;
  VRle *local_298;
  VRle *local_290;
  VPainter *local_288;
  undefined1 local_280 [16];
  VPainter local_270;
  VPainter local_150;
  
  local_2a0 = src;
  local_298 = mask;
  local_290 = matteRle;
  local_288 = painter;
  VVar4 = VPainter::clipBoundingRect(painter);
  local_150.mBuffer.mFormat = ARGB32_Premultiplied;
  local_150.mBuffer.mWidth = 0;
  local_150.mBuffer.mHeight = 0;
  local_150.mBuffer.mBytesPerLine = 0;
  local_150.mBuffer.mBytesPerPixel = 0;
  local_150.mBuffer.mBuffer = (uint8_t *)0x0;
  local_150.mSpanData.mBlendMode = SrcOver;
  local_150.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_150.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150.mSpanData.mOffset.mx = 0;
  local_150.mSpanData.mOffset.my = 0;
  local_150.mSpanData.mDrawableSize.mw = 0;
  local_150.mSpanData.mDrawableSize.mh = 0;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mFormat = ARGB32_Premultiplied;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mWidth = 0;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mHeight = 0;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mBytesPerLine = 0;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mBytesPerPixel = 0;
  local_150.mSpanData.mTexture.super_VRasterBuffer.mBuffer = (uint8_t *)0x0;
  local_150.mSpanData.fast_matrix = true;
  local_150.mSpanData.transformType = None;
  local_2a8 = (size_t)(VVar4.x2 - VVar4.x1);
  format = (Format)(VVar4._8_8_ - (VVar4._0_8_ & 0xffffffff00000000) >> 0x20);
  SurfaceCache::make_surface((SurfaceCache *)local_2c0,(size_t)cache,local_2a8,format);
  VPainter::begin(&local_150,(VBitmap *)local_2c0);
  pVVar2 = local_290;
  pVVar1 = local_298;
  (*local_2a0->_vptr_Layer[4])(local_2a0,&local_150,local_298,local_290,cache);
  VPainter::end(&local_150);
  local_270.mBuffer.mFormat = ARGB32_Premultiplied;
  local_270.mBuffer.mWidth = 0;
  local_270.mBuffer.mHeight = 0;
  local_270.mBuffer.mBytesPerLine = 0;
  local_270.mBuffer.mBytesPerPixel = 0;
  local_270.mBuffer.mBuffer = (uint8_t *)0x0;
  local_270.mSpanData.mBlendMode = SrcOver;
  local_270.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_270.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_270.mSpanData.mOffset.mx = 0;
  local_270.mSpanData.mOffset.my = 0;
  local_270.mSpanData.mDrawableSize.mw = 0;
  local_270.mSpanData.mDrawableSize.mh = 0;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mFormat = ARGB32_Premultiplied;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mWidth = 0;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mHeight = 0;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mBytesPerLine = 0;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mBytesPerPixel = 0;
  local_270.mSpanData.mTexture.super_VRasterBuffer.mBuffer = (uint8_t *)0x0;
  local_270.mSpanData.fast_matrix = true;
  local_270.mSpanData.transformType = None;
  SurfaceCache::make_surface((SurfaceCache *)local_280,(size_t)cache,local_2a8,format);
  VPainter::begin(&local_270,(VBitmap *)local_280);
  (*layer->_vptr_Layer[4])(layer,&local_270,pVVar1,pVVar2);
  bVar3 = layer->mLayerData->mMatteType - Alpha;
  if (bVar3 < 4) {
    VPainter::setBlendMode(&local_270,*(BlendMode *)(&DAT_00141a60 + (ulong)bVar3 * 4));
  }
  if ((byte)(layer->mLayerData->mMatteType - Luma) < 2) {
    VBitmap::updateLuma((VBitmap *)local_2c0);
  }
  local_2b8 = VPainter::clipBoundingRect(&local_270);
  (*layer->_vptr_Layer[3])(layer);
  if (extraout_RDX == 1) {
    (*layer->_vptr_Layer[3])(layer);
    VDrawable::rle((VDrawable *)(local_280 + 8));
    local_2b8 = VRle::Data::bbox((Data *)(local_280._8_8_ + 8));
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)(local_280 + 8));
  }
  VPainter::drawBitmap(&local_270,&local_2b8,(value_type *)local_2c0,&local_2b8,0xff);
  VPainter::end(&local_270);
  VPainter::drawBitmap(local_288,&local_2b8,(value_type *)local_280,&local_2b8,0xff);
  std::vector<VBitmap,_std::allocator<VBitmap>_>::push_back(&cache->mCache,(value_type *)local_2c0);
  std::vector<VBitmap,_std::allocator<VBitmap>_>::push_back(&cache->mCache,(value_type *)local_280);
  vshared_ptr<VBitmap::Impl,_unsigned_long>::unref
            ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)local_280);
  if (local_270.mSpanData.mColorTable.
      super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.mSpanData.mColorTable.
               super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  vshared_ptr<VBitmap::Impl,_unsigned_long>::unref
            ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)local_2c0);
  if (local_150.mSpanData.mColorTable.
      super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.mSpanData.mColorTable.
               super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void renderer::CompLayer::renderMatteLayer(VPainter *painter, const VRle &mask,
                                           const VRle &     matteRle,
                                           renderer::Layer *layer,
                                           renderer::Layer *src,
                                           SurfaceCache &   cache)
{
    VSize size = painter->clipBoundingRect().size();
    // Decide if we can use fast matte.
    // 1. draw src layer to matte buffer
    VPainter srcPainter;
    VBitmap  srcBitmap = cache.make_surface(size.width(), size.height());
    srcPainter.begin(&srcBitmap);
    src->render(&srcPainter, mask, matteRle, cache);
    srcPainter.end();

    // 2. draw layer to layer buffer
    VPainter layerPainter;
    VBitmap  layerBitmap = cache.make_surface(size.width(), size.height());
    layerPainter.begin(&layerBitmap);
    layer->render(&layerPainter, mask, matteRle, cache);

    // 2.1update composition mode
    switch (layer->matteType()) {
    case model::MatteType::Alpha:
    case model::MatteType::Luma: {
        layerPainter.setBlendMode(BlendMode::DestIn);
        break;
    }
    case model::MatteType::AlphaInv:
    case model::MatteType::LumaInv: {
        layerPainter.setBlendMode(BlendMode::DestOut);
        break;
    }
    default:
        break;
    }

    // 2.2 update srcBuffer if the matte is luma type
    if (layer->matteType() == model::MatteType::Luma ||
        layer->matteType() == model::MatteType::LumaInv) {
        srcBitmap.updateLuma();
    }

    auto clip = layerPainter.clipBoundingRect();

    // if the layer has only one renderer then use it as the clip rect
    // when blending 2 buffer and copy back to final buffer to avoid
    // unnecessary pixel processing.
    if (layer->renderList().size() == 1)
    {
        clip = layer->renderList()[0]->rle().boundingRect();
    }

    // 2.3 draw src buffer as mask
    layerPainter.drawBitmap(clip, srcBitmap, clip);
    layerPainter.end();
    // 3. draw the result buffer into painter
    painter->drawBitmap(clip, layerBitmap, clip);

    cache.release_surface(srcBitmap);
    cache.release_surface(layerBitmap);
}